

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

bool __thiscall Json::Value::isDouble(Value *this)

{
  bool bVar1;
  bool bVar2;
  string local_38;
  
  bVar1 = true;
  if (this->field_0x8 != '\x04') {
    if (this->field_0x8 == '\x05') {
      asString_abi_cxx11_(&local_38,this);
      bVar1 = convertToDouble(local_38._M_dataplus._M_p,(double *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p);
      }
    }
    else {
      bVar2 = isInt64(this);
      if (!bVar2) {
        bVar1 = isUInt64(this);
        return bVar1;
      }
    }
  }
  return bVar1;
}

Assistant:

bool Value::isDouble() const {
  switch (type_) {
  case realValue:
    return true;
  case stringValue:
    return convertToDouble(asString().c_str(), NULL);
  default:
    break;
  }

  return isIntegral();
}